

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O2

void __thiscall CMapImages::LoadMapImages(CMapImages *this,IMap *pMap,CLayers *pLayers,int MapType)

{
  long lVar1;
  IGraphics *pIVar2;
  bool bVar3;
  int *piVar4;
  CMapItemLayer *pCVar5;
  int *piVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  int i;
  long lVar8;
  ulong uVar9;
  anon_struct_260_2_b6f809b8 *paVar10;
  int k;
  int iVar11;
  anon_struct_260_2_b6f809b8 *paVar12;
  ulong uVar13;
  bool bVar14;
  long in_FS_OFFSET;
  int Start;
  char Buf [512];
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)MapType < 2) {
    paVar12 = this->m_Info + (uint)MapType;
    piVar4 = &this->m_Info[(uint)MapType].m_Count;
    paVar10 = paVar12;
    for (lVar8 = 0; lVar8 < this->m_Info[(uint)MapType].m_Count; lVar8 = lVar8 + 1) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0xf])(pIVar2,paVar10);
      paVar10 = (anon_struct_260_2_b6f809b8 *)(paVar10->m_aTextures + 1);
    }
    *piVar4 = 0;
    (*(pMap->super_IInterface)._vptr_IInterface[6])(pMap,2,&Start,piVar4);
    iVar11 = 0x40;
    if (*piVar4 < 0x40) {
      iVar11 = *piVar4;
    }
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    *piVar4 = iVar11;
    for (uVar9 = 0; (long)uVar9 < (long)iVar11; uVar9 = uVar9 + 1) {
      bVar3 = false;
      bVar14 = false;
      for (iVar11 = 0; iVar11 < pLayers->m_LayersNum; iVar11 = iVar11 + 1) {
        pCVar5 = CLayers::GetLayer(pLayers,iVar11);
        if (((!bVar14) && (pCVar5->m_Type == 3)) && (uVar9 == (uint)pCVar5[2].m_Version)) {
          bVar14 = true;
        }
        if (((!bVar3) && (pCVar5->m_Type == 2)) && (uVar9 == (uint)pCVar5[4].m_Type)) {
          bVar3 = true;
        }
      }
      uVar13 = (ulong)((uint)bVar14 * 4 + 4);
      if (!bVar3) {
        uVar13 = 0;
      }
      iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[5])
                         (pMap,(ulong)(uint)(Start + (int)uVar9),0,0);
      piVar6 = (int *)CONCAT44(extraout_var,iVar11);
      if ((piVar6[3] == 0) && ((*piVar6 < 2 || ((uint)piVar6[6] < 2)))) {
        iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar6[5]);
        uVar7 = 1;
        if (*piVar6 != 1) {
          uVar7 = (ulong)(uint)piVar6[6];
        }
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        iVar11 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
                           (pIVar2,(ulong)(uint)piVar6[1],(ulong)(uint)piVar6[2],uVar7,
                            CONCAT44(extraout_var_01,iVar11),1,(int)uVar13);
        paVar12->m_aTextures[uVar9].m_Id = iVar11;
        (*(pMap->super_IInterface)._vptr_IInterface[4])(pMap,(ulong)(uint)piVar6[5]);
      }
      else {
        iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar6[4]);
        str_format(Buf,0x200,"mapres/%s.png",CONCAT44(extraout_var_00,iVar11));
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        iVar11 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x12])
                           (pIVar2,Buf,0xffffffff,0xffffffffffffffff,uVar13);
        paVar12->m_aTextures[uVar9].m_Id = iVar11;
      }
      iVar11 = *piVar4;
    }
    bVar3 = CGameClient::IsEaster((this->super_CComponent).m_pClient);
    if (bVar3) {
      GetEasterTexture(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapImages::LoadMapImages(IMap *pMap, class CLayers *pLayers, int MapType)
{
	if(MapType < 0 || MapType >= NUM_MAP_TYPES)
		return;

	// unload all textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
		Graphics()->UnloadTexture(&(m_Info[MapType].m_aTextures[i]));
	m_Info[MapType].m_Count = 0;

	int Start;
	pMap->GetType(MAPITEMTYPE_IMAGE, &Start, &m_Info[MapType].m_Count);
	m_Info[MapType].m_Count = clamp(m_Info[MapType].m_Count, 0, int(MAX_TEXTURES));

	// load new textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
	{
		int TextureFlags = 0;
		bool FoundQuadLayer = false;
		bool FoundTileLayer = false;
		for(int k = 0; k < pLayers->NumLayers(); k++)
		{
			const CMapItemLayer * const pLayer = pLayers->GetLayer(k);
			if(!FoundQuadLayer && pLayer->m_Type == LAYERTYPE_QUADS && ((const CMapItemLayerQuads *)pLayer)->m_Image == i)
				FoundQuadLayer = true;
			if(!FoundTileLayer && pLayer->m_Type == LAYERTYPE_TILES && ((const CMapItemLayerTilemap *)pLayer)->m_Image == i)
				FoundTileLayer = true;
		}
		if(FoundTileLayer)
			TextureFlags = FoundQuadLayer ? IGraphics::TEXLOAD_MULTI_DIMENSION : IGraphics::TEXLOAD_ARRAY_256;

		CMapItemImage *pImg = (CMapItemImage *)pMap->GetItem(Start+i, 0, 0);
		if(pImg->m_External || (pImg->m_Version > 1 && pImg->m_Format != CImageInfo::FORMAT_RGB && pImg->m_Format != CImageInfo::FORMAT_RGBA))
		{
			char Buf[IO_MAX_PATH_LENGTH];
			char *pName = (char *)pMap->GetData(pImg->m_ImageName);
			str_format(Buf, sizeof(Buf), "mapres/%s.png", pName);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTexture(Buf, IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, TextureFlags);
		}
		else
		{
			void *pData = pMap->GetData(pImg->m_ImageData);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pImg->m_Format, pData, CImageInfo::FORMAT_RGBA, TextureFlags);
			pMap->UnloadData(pImg->m_ImageData);
		}
	}

	// easter time, preload easter tileset
	if(m_pClient->IsEaster())
		GetEasterTexture();
}